

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allocators.hh
# Opt level: O0

void __thiscall
tchecker::refzg::details::
state_pool_allocator_t<tchecker::make_shared_t<tchecker::refzg::state_t,_unsigned_long,_1UL>_>::
state_pool_allocator_t
          (state_pool_allocator_t<tchecker::make_shared_t<tchecker::refzg::state_t,_unsigned_long,_1UL>_>
           *this,size_t state_alloc_nb,size_t vloc_alloc_nb,size_t vloc_capacity,
          size_t intval_alloc_nb,size_t intval_capacity,size_t zone_alloc_nb,
          shared_ptr<const_tchecker::reference_clock_variables_t> *ref_clocks,size_t table_size)

{
  size_t alloc_size;
  periodic_collectable_cache_t<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::refzg::zone_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_delegate_hash_t,_tchecker::intrusive_shared_ptr_delegate_equal_to_t>
  *this_00;
  shared_ptr<tchecker::collectable_t> local_58 [2];
  size_t local_38;
  size_t intval_capacity_local;
  size_t intval_alloc_nb_local;
  size_t vloc_capacity_local;
  size_t vloc_alloc_nb_local;
  size_t state_alloc_nb_local;
  state_pool_allocator_t<tchecker::make_shared_t<tchecker::refzg::state_t,_unsigned_long,_1UL>_>
  *this_local;
  
  local_38 = intval_capacity;
  intval_capacity_local = intval_alloc_nb;
  intval_alloc_nb_local = vloc_capacity;
  vloc_capacity_local = vloc_alloc_nb;
  vloc_alloc_nb_local = state_alloc_nb;
  state_alloc_nb_local = (size_t)this;
  ta::details::
  state_pool_allocator_t<tchecker::make_shared_t<tchecker::refzg::state_t,_unsigned_long,_1UL>_>::
  state_pool_allocator_t
            (&this->
              super_state_pool_allocator_t<tchecker::make_shared_t<tchecker::refzg::state_t,_unsigned_long,_1UL>_>
             ,state_alloc_nb,vloc_alloc_nb,vloc_capacity,intval_alloc_nb,intval_capacity,table_size)
  ;
  std::shared_ptr<const_tchecker::reference_clock_variables_t>::shared_ptr
            (&this->_ref_clocks,ref_clocks);
  alloc_size = allocation_size_t<tchecker::make_shared_t<tchecker::refzg::zone_t,unsigned_long,1ul>>
               ::alloc_size<std::shared_ptr<tchecker::reference_clock_variables_t_const>&>
                         (&this->_ref_clocks);
  pool_t<tchecker::make_shared_t<tchecker::refzg::zone_t,_unsigned_long,_1UL>_>::pool_t
            (&this->_zone_pool,zone_alloc_nb,alloc_size);
  this_00 = (periodic_collectable_cache_t<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::refzg::zone_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_delegate_hash_t,_tchecker::intrusive_shared_ptr_delegate_equal_to_t>
             *)operator_new(0x58);
  periodic_collectable_cache_t<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::refzg::zone_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_delegate_hash_t,_tchecker::intrusive_shared_ptr_delegate_equal_to_t>
  ::periodic_collectable_cache_t(this_00,table_size);
  std::
  shared_ptr<tchecker::periodic_collectable_cache_t<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::refzg::zone_t,unsigned_long,1ul>>,tchecker::intrusive_shared_ptr_delegate_hash_t,tchecker::intrusive_shared_ptr_delegate_equal_to_t>>
  ::
  shared_ptr<tchecker::periodic_collectable_cache_t<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::refzg::zone_t,unsigned_long,1ul>>,tchecker::intrusive_shared_ptr_delegate_hash_t,tchecker::intrusive_shared_ptr_delegate_equal_to_t>,void>
            ((shared_ptr<tchecker::periodic_collectable_cache_t<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::refzg::zone_t,unsigned_long,1ul>>,tchecker::intrusive_shared_ptr_delegate_hash_t,tchecker::intrusive_shared_ptr_delegate_equal_to_t>>
              *)&this->_zone_cache,this_00);
  std::shared_ptr<tchecker::collectable_t>::
  shared_ptr<tchecker::periodic_collectable_cache_t<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::refzg::zone_t,unsigned_long,1ul>>,tchecker::intrusive_shared_ptr_delegate_hash_t,tchecker::intrusive_shared_ptr_delegate_equal_to_t>,void>
            (local_58,&this->_zone_cache);
  pool_t<tchecker::make_shared_t<tchecker::refzg::zone_t,_unsigned_long,_1UL>_>::enroll
            (&this->_zone_pool,local_58);
  std::shared_ptr<tchecker::collectable_t>::~shared_ptr(local_58);
  return;
}

Assistant:

state_pool_allocator_t(std::size_t state_alloc_nb, std::size_t vloc_alloc_nb, std::size_t vloc_capacity,
                         std::size_t intval_alloc_nb, std::size_t intval_capacity, std::size_t zone_alloc_nb,
                         std::shared_ptr<tchecker::reference_clock_variables_t const> const & ref_clocks,
                         std::size_t table_size)
      : tchecker::ta::details::state_pool_allocator_t<STATE>(state_alloc_nb, vloc_alloc_nb, vloc_capacity, intval_alloc_nb,
                                                             intval_capacity, table_size),
        _ref_clocks(ref_clocks),
        _zone_pool(zone_alloc_nb, tchecker::allocation_size_t<tchecker::refzg::shared_zone_t>::alloc_size(_ref_clocks)),
        _zone_cache(new zone_cache_t(table_size))
  {
    _zone_pool.enroll(_zone_cache);
  }